

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O3

void __thiscall spvtools::opt::IRContext::AddVarToEntryPoints(IRContext *this,uint32_t var_id)

{
  Module *pMVar1;
  pointer pOVar2;
  uint **ppuVar3;
  char cVar4;
  uint **ppuVar5;
  pointer pOVar6;
  Instruction *inst;
  bool found;
  uint32_t ocnt;
  undefined1 local_ad;
  PodType local_ac;
  IRContext *local_a8;
  undefined4 local_9c;
  SmallVector<unsigned_int,_2UL> *local_98;
  undefined1 local_90 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_70;
  undefined1 local_68 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_48;
  Instruction *local_40;
  uint *local_38;
  
  local_9c = 0;
  pMVar1 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  inst = *(Instruction **)
          ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  local_40 = (Instruction *)
             ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  if (inst != local_40) {
    local_ac.data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)var_id;
    local_a8 = this;
    do {
      local_ad = (_func_int)0x0;
      local_68._8_8_ = 0;
      local_68._0_8_ = operator_new(0x18);
      *(undefined4 **)local_68._0_8_ = &local_9c;
      *(undefined1 **)(local_68._0_8_ + 8) = &local_ad;
      *(PodType **)(local_68._0_8_ + 0x10) = &local_ac;
      local_68._24_8_ =
           std::
           _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:841:24)>
           ::_M_invoke;
      local_68._16_8_ =
           std::
           _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:841:24)>
           ::_M_manager;
      local_90._0_8_ = (_func_int **)0x0;
      local_90._16_8_ =
           std::
           _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:876:22)>
           ::_M_invoke;
      local_90._8_8_ =
           std::
           _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:876:22)>
           ::_M_manager;
      pOVar6 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pOVar2 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_98 = (SmallVector<unsigned_int,_2UL> *)local_68;
      if (pOVar6 == pOVar2) {
LAB_00592e8d:
        (*(code *)local_90._8_8_)((Operand *)&local_98,(Operand *)&local_98,3);
      }
      else {
        do {
          if ((pOVar6->type & ~SPV_OPERAND_TYPE_ID) != SPV_OPERAND_TYPE_TYPE_ID) {
            ppuVar3 = (uint **)(pOVar6->words).large_data_._M_t.
                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl;
            ppuVar5 = &(pOVar6->words).small_data_;
            if (ppuVar3 != (uint **)0x0) {
              ppuVar5 = ppuVar3;
            }
            local_38 = *ppuVar5;
            if ((code *)local_90._8_8_ == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            cVar4 = (*(code *)local_90._16_8_)((Operand *)&local_98,&local_38);
            if (cVar4 == '\0') break;
          }
          pOVar6 = pOVar6 + 1;
        } while (pOVar6 != pOVar2);
        if ((code *)local_90._8_8_ != (code *)0x0) goto LAB_00592e8d;
      }
      if ((PodType  [2])local_68._16_8_ != (PodType  [2])0x0) {
        (*(code *)local_68._16_8_)
                  ((SmallVector<unsigned_int,_2UL> *)local_68,
                   (SmallVector<unsigned_int,_2UL> *)local_68,3);
      }
      if (local_ad == (_func_int)0x0) {
        local_68._0_8_ = &PTR__SmallVector_00b02ef8;
        local_68._24_8_ = local_68 + 0x10;
        local_48._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_68._16_4_ = local_ac.data._M_elems;
        local_68._8_8_ = 1;
        local_98 = (SmallVector<unsigned_int,_2UL> *)CONCAT44(local_98._4_4_,1);
        local_90._0_8_ = &PTR__SmallVector_00b02ef8;
        local_90._8_8_ = (code *)0x0;
        local_90._24_8_ = local_90 + 0x10;
        local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)local_90,
                   (SmallVector<unsigned_int,_2UL> *)local_68);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&inst->operands_,(Operand *)&local_98);
        local_90._0_8_ = &PTR__SmallVector_00b02ef8;
        if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )local_70._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_70,local_70._M_head_impl);
        }
        local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_68._0_8_ = &PTR__SmallVector_00b02ef8;
        if (local_48._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_48,local_48._M_head_impl);
        }
        if ((local_a8->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          BuildDefUseManager(local_a8);
        }
        analysis::DefUseManager::AnalyzeInstDefUse
                  ((local_a8->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,inst);
      }
      inst = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (inst != local_40);
  }
  return;
}

Assistant:

void IRContext::AddVarToEntryPoints(uint32_t var_id) {
  uint32_t ocnt = 0;
  for (auto& e : module()->entry_points()) {
    bool found = false;
    e.ForEachInOperand([&ocnt, &found, &var_id](const uint32_t* idp) {
      if (ocnt >= kEntryPointInterfaceInIdx) {
        if (*idp == var_id) found = true;
      }
      ++ocnt;
    });
    if (!found) {
      e.AddOperand({SPV_OPERAND_TYPE_ID, {var_id}});
      get_def_use_mgr()->AnalyzeInstDefUse(&e);
    }
  }
}